

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O0

void gimage::gauss<float>(Image<float,_gimage::PixelTraits<float>_> *image,float s)

{
  int iVar1;
  float *pfVar2;
  long lVar3;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  float fVar4;
  long k_2;
  float *tp_1;
  long k_1;
  long i_2;
  long i_1;
  float *tp;
  long i;
  long k;
  int d;
  float *p;
  ImageFloat tmp;
  GaussKernel kernel;
  float in_stack_fffffffffffffeec;
  GaussKernel *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffff00;
  GaussKernel *in_stack_ffffffffffffff38;
  float *in_stack_ffffffffffffff40;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffff48;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_ffffffffffffff50;
  Image<float,_gimage::PixelTraits<float>_> *pIVar5;
  GaussKernel *in_stack_ffffffffffffff58;
  GaussKernel *pGVar6;
  float *local_a0;
  long local_98;
  long local_90;
  int local_84;
  long local_68;
  long local_60;
  Image<float,_gimage::PixelTraits<float>_> local_58;
  Image<float,_gimage::PixelTraits<float>_> *local_8;
  
  local_8 = in_RDI;
  GaussKernel::GaussKernel(in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
  local_60 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8);
  local_68 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_8);
  std::max<long>(&local_60,&local_68);
  Image<float,_gimage::PixelTraits<float>_>::Image
            (in_stack_ffffffffffffff00,CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
             ,(long)in_stack_fffffffffffffef0,(int)in_stack_fffffffffffffeec);
  pfVar2 = Image<float,_gimage::PixelTraits<float>_>::getPtr(&local_58,0,0,0);
  local_84 = 0;
  while( true ) {
    iVar1 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_8);
    if (iVar1 <= local_84) break;
    local_90 = 0;
    while( true ) {
      lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_8);
      if (lVar3 <= local_90) break;
      local_98 = 0;
      while( true ) {
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8);
        if (lVar3 <= local_98) break;
        fVar4 = GaussKernel::convolveHorizontal<float>
                          (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           (long)in_stack_ffffffffffffff48,(long)in_stack_ffffffffffffff40,
                           (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        pfVar2[local_98] = fVar4;
        local_98 = local_98 + 1;
      }
      local_a0 = Image<float,_gimage::PixelTraits<float>_>::getPtr(local_8,0,local_90,local_84);
      pGVar6 = (GaussKernel *)0x0;
      while( true ) {
        in_stack_ffffffffffffff58 = pGVar6;
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8);
        if (lVar3 <= (long)pGVar6) break;
        *local_a0 = pfVar2[(long)in_stack_ffffffffffffff58];
        pGVar6 = (GaussKernel *)((long)&in_stack_ffffffffffffff58->kernel + 1);
        local_a0 = local_a0 + 1;
      }
      local_90 = local_90 + 1;
    }
    pIVar5 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
    while( true ) {
      in_stack_ffffffffffffff50 = pIVar5;
      lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8);
      if (lVar3 <= (long)pIVar5) break;
      in_stack_ffffffffffffff00 = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
      while( true ) {
        in_stack_ffffffffffffff48 = in_stack_ffffffffffffff00;
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_8);
        if (lVar3 <= (long)in_stack_ffffffffffffff00) break;
        fVar4 = GaussKernel::convolveVertical<float>
                          (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           (long)in_stack_ffffffffffffff48,(long)in_stack_ffffffffffffff40,
                           (int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
        pfVar2[(long)in_stack_ffffffffffffff48] = fVar4;
        in_stack_ffffffffffffff00 =
             (Image<float,_gimage::PixelTraits<float>_> *)
             ((long)&in_stack_ffffffffffffff48->depth + 1);
      }
      in_stack_ffffffffffffff40 =
           Image<float,_gimage::PixelTraits<float>_>::getPtr
                     (local_8,(long)in_stack_ffffffffffffff50,0,local_84);
      in_stack_fffffffffffffef0 = (GaussKernel *)0x0;
      while( true ) {
        in_stack_ffffffffffffff38 = in_stack_fffffffffffffef0;
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_8);
        if (lVar3 <= (long)in_stack_fffffffffffffef0) break;
        *in_stack_ffffffffffffff40 = pfVar2[(long)in_stack_ffffffffffffff38];
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8);
        in_stack_ffffffffffffff40 = in_stack_ffffffffffffff40 + lVar3;
        in_stack_fffffffffffffef0 = (GaussKernel *)((long)&in_stack_ffffffffffffff38->kernel + 1);
      }
      pIVar5 = (Image<float,_gimage::PixelTraits<float>_> *)
               ((long)&in_stack_ffffffffffffff50->depth + 1);
    }
    local_84 = local_84 + 1;
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(in_stack_ffffffffffffff00);
  GaussKernel::~GaussKernel(in_stack_fffffffffffffef0);
  return;
}

Assistant:

void gauss(Image<T> &image, float s)
{
  GaussKernel kernel(s);

  ImageFloat tmp(std::max(image.getWidth(), image.getHeight()), 1, 1);
  float *p=tmp.getPtr(0, 0, 0);

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal in place

    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        p[i]=kernel.convolveHorizontal(image, i, k, d);
      }

      T *tp=image.getPtr(0, k, d);
      for (long i=0; i<image.getWidth(); i++)
      {
        *tp++=static_cast<T>(p[i]);
      }
    }

    // convolve vertically in place

    for (long i=0; i<image.getWidth(); i++)
    {
      for (long k=0; k<image.getHeight(); k++)
      {
        p[k]=kernel.convolveVertical(image, i, k, d);
      }

      T *tp=image.getPtr(i, 0, d);
      for (long k=0; k<image.getHeight(); k++)
      {
        *tp=static_cast<T>(p[k]);
        tp+=image.getWidth();
      }
    }
  }
}